

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

Function * __thiscall spvtools::opt::IRContext::GetFunction(IRContext *this,uint32_t id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  Function *pFVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  if ((this->valid_analyses_ & kAnalysisIdToFuncMapping) == kAnalysisNone) {
    BuildIdToFuncMapping(this);
  }
  uVar1 = (this->id_to_func_)._M_h._M_bucket_count;
  uVar4 = (ulong)id % uVar1;
  p_Var5 = (this->id_to_func_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(uint32_t *)&p_Var5->_M_nxt[1]._M_nxt != id)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var2[1]._M_nxt == id)) goto LAB_001ba50e;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001ba50e:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    pFVar3 = (Function *)0x0;
  }
  else {
    pFVar3 = (Function *)p_Var2[2]._M_nxt;
  }
  return pFVar3;
}

Assistant:

Function* GetFunction(uint32_t id) {
    if (!AreAnalysesValid(kAnalysisIdToFuncMapping)) {
      BuildIdToFuncMapping();
    }
    auto entry = id_to_func_.find(id);
    return (entry != id_to_func_.end()) ? entry->second : nullptr;
  }